

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O1

void __thiscall cmCursesMainForm::PrintKeys(cmCursesMainForm *this,int process)

{
  FORM *form;
  char cVar1;
  int iVar2;
  FIELD *field;
  long *plVar3;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  char fmt_s [3];
  char secondLine [512];
  char firstLine [512];
  char thirdLine [512];
  char fmt [512];
  undefined2 local_82c;
  undefined1 local_82a;
  char local_828 [512];
  char local_628 [512];
  char local_428 [512];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined4 local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined1 uStack_1f8;
  undefined4 uStack_1f7;
  undefined4 uStack_1f3;
  
  iVar2 = -1;
  iVar6 = -1;
  if (_stdscr != 0) {
    iVar6 = *(short *)(_stdscr + 4) + 1;
    iVar2 = *(short *)(_stdscr + 6) + 1;
  }
  if (((0x40 < iVar2) && (this->InitialWidth <= iVar2)) && (5 < iVar6)) {
    form = (this->super_cmCursesForm).Form;
    if (form == (FORM *)0x0) {
      plVar3 = (long *)0x0;
    }
    else {
      field = current_field(form);
      plVar3 = (long *)field_userptr(field);
    }
    local_82a = 0;
    local_82c = 0x7325;
    if ((plVar3 == (long *)0x0) || (cVar1 = (**(code **)(*plVar3 + 0x30))(plVar3), cVar1 == '\0')) {
      memset(local_628,0,0x200);
      memset(local_828,0,0x200);
      memset(local_428,0,0x200);
      if (process == 0) {
        if (this->OkToGenerate == true) {
          pcVar5 = "      [l] Show log output   [c] Configure       [g] Generate        ";
        }
        else {
          pcVar5 = "      [l] Show log output   [c] Configure                           ";
        }
        memcpy(local_628,pcVar5,0x45);
        pcVar5 = "off";
        if (this->AdvancedMode != false) {
          pcVar5 = "on";
        }
        snprintf(local_428,0x200,"      [t] Toggle advanced mode (currently %s)",pcVar5);
        builtin_strncpy(local_828 + 0x30,"erating",8);
        builtin_strncpy(local_828,"      [h] Help  ",0x10);
        builtin_strncpy(local_828 + 0x18,"    [q] Quit without gen",0x18);
      }
      else {
        builtin_strncpy(local_628 + 0x40,"    ",4);
        builtin_strncpy(local_628 + 0x30,"                ",0x10);
        builtin_strncpy(local_628 + 0x20,"                ",0x10);
        builtin_strncpy(local_628 + 0x10,"                ",0x10);
        builtin_strncpy(local_628,"                ",0x10);
        builtin_strncpy(local_828,"                ",0x10);
        builtin_strncpy(local_828 + 0x18,"                                            ",0x2c);
        builtin_strncpy(local_428,
                        "                                                                    ",0x44)
        ;
      }
      builtin_strncpy(local_828 + 0x10,"        ",8);
      move(iVar6 + -4,0);
      memcpy(&local_228,"Keys: [enter] Edit an entry [d] Delete an entry",0x200);
      if (process != 0) {
        uStack_1f8 = 0x20;
        uStack_1f7 = 0x20202020;
        uStack_1f3 = 0x20202020;
        uStack_208 = 0x20202020;
        uStack_204 = 0x20202020;
        uStack_200 = 0x20202020;
        uStack_1fc = 0x20202020;
        local_218 = 0x20202020;
        uStack_214 = 0x20202020;
        uStack_210 = 0x20202020;
        uStack_20c = 0x20202020;
        local_228 = 0x20202020;
        uStack_224 = 0x20202020;
        uStack_220 = 0x20202020;
        uStack_21c = 0x20202020;
      }
      printw(&local_82c,&local_228);
      move(iVar6 + -3,0);
      printw(&local_82c,local_628);
      move(iVar6 + -2,0);
      printw(&local_82c,local_828);
      move(iVar6 + -1,0);
      printw(&local_82c);
    }
    if (plVar3 != (long *)0x0) {
      memset(local_628,0,0x200);
      snprintf(local_628,0x200,"Page %d of %d",(ulong)*(uint *)(plVar3 + 7),
               (ulong)(uint)this->NumberOfPages);
      sVar4 = strlen(local_628);
      move(0,0x40 - (int)sVar4);
      printw(&local_82c,local_628);
    }
    pos_form_cursor((this->super_cmCursesForm).Form);
  }
  return;
}

Assistant:

void cmCursesMainForm::PrintKeys(int process /* = 0 */)
{
  int x;
  int y;
  getmaxyx(stdscr, y, x);
  if (x < cmCursesMainForm::MIN_WIDTH || x < this->InitialWidth ||
      y < cmCursesMainForm::MIN_HEIGHT) {
    return;
  }

  // Give the current widget (if it exists), a chance to print keys
  cmCursesWidget* cw = nullptr;
  if (this->Form) {
    FIELD* currentField = current_field(this->Form);
    cw = reinterpret_cast<cmCursesWidget*>(field_userptr(currentField));
  }

  char fmt_s[] = "%s";
  if (cw == nullptr || !cw->PrintKeys()) {
    char firstLine[512] = "";
    char secondLine[512] = "";
    char thirdLine[512] = "";
    if (process) {
      memset(firstLine, ' ', 68);
      memset(secondLine, ' ', 68);
      memset(thirdLine, ' ', 68);
    } else {
      if (this->OkToGenerate) {
        snprintf(firstLine, sizeof(firstLine),
                 "      [l] Show log output   [c] Configure"
                 "       [g] Generate        ");
      } else {
        snprintf(firstLine, sizeof(firstLine),
                 "      [l] Show log output   [c] Configure"
                 "                           ");
      }
      {
        const char* toggleKeyInstruction =
          "      [t] Toggle advanced mode (currently %s)";
        snprintf(thirdLine, sizeof(thirdLine), toggleKeyInstruction,
                 this->AdvancedMode ? "on" : "off");
      }
      snprintf(secondLine, sizeof(secondLine),
               "      [h] Help              [q] Quit without generating");
    }

    curses_move(y - 4, 0);
    char fmt[512] = "Keys: [enter] Edit an entry [d] Delete an entry";
    if (process) {
      memset(fmt, ' ', 57);
    }
    printw(fmt_s, fmt);
    curses_move(y - 3, 0);
    printw(fmt_s, firstLine);
    curses_move(y - 2, 0);
    printw(fmt_s, secondLine);
    curses_move(y - 1, 0);
    printw(fmt_s, thirdLine);
  }

  if (cw) {
    char pageLine[512] = "";
    snprintf(pageLine, sizeof(pageLine), "Page %d of %d", cw->GetPage(),
             this->NumberOfPages);
    curses_move(0, 65 - static_cast<unsigned int>(strlen(pageLine)) - 1);
    printw(fmt_s, pageLine);
  }

  pos_form_cursor(this->Form);
}